

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_ldm_blockCompress
                 (rawSeqStore_t *rawSeqStore,ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_paramSwitch_e useRowMatchFinder,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  rawSeq *prVar2;
  undefined8 *puVar3;
  BYTE *pBVar4;
  undefined8 *puVar5;
  BYTE *pBVar6;
  seqDef *psVar7;
  undefined8 uVar8;
  uint uVar9;
  uint uVar10;
  ZSTD_blockCompressor UNRECOVERED_JUMPTABLE;
  size_t sVar11;
  ZSTD_dictMode_e dictMode;
  uint uVar12;
  BYTE *pBVar13;
  ulong uVar14;
  undefined8 *puVar15;
  long lVar16;
  ulong uVar18;
  ulong uVar19;
  void *pvVar20;
  BYTE *litLimit_w;
  ulong local_38;
  U32 UVar17;
  
  dictMode = ZSTD_extDict;
  if ((ms->window).dictLimit <= (ms->window).lowLimit) {
    if (ms->dictMatchState == (ZSTD_matchState_t *)0x0) {
      dictMode = ZSTD_noDict;
    }
    else {
      dictMode = ZSTD_dedicatedDictSearch - (ms->dictMatchState->dedicatedDictSearch == 0);
    }
  }
  uVar10 = (ms->cParams).minMatch;
  UNRECOVERED_JUMPTABLE =
       ZSTD_selectBlockCompressor((ms->cParams).strategy,useRowMatchFinder,dictMode);
  if (6 < (int)(ms->cParams).strategy) {
    ms->ldmSeqStore = rawSeqStore;
    sVar11 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,srcSize);
    ZSTD_ldm_skipRawSeqStoreBytes(rawSeqStore,srcSize);
    return sVar11;
  }
  pvVar20 = (void *)(srcSize + (long)src);
  puVar1 = (undefined8 *)((long)pvVar20 - 0x20);
  do {
    uVar18 = rawSeqStore->pos;
    if ((rawSeqStore->size <= uVar18) || (pvVar20 <= src)) break;
    prVar2 = rawSeqStore->seq + uVar18;
    uVar19._0_4_ = prVar2->offset;
    uVar19._4_4_ = prVar2->litLength;
    uVar14 = uVar19 >> 0x20;
    uVar9 = rawSeqStore->seq[uVar18].matchLength;
    local_38 = (ulong)uVar9;
    uVar12 = (uint)((long)pvVar20 - (long)src);
    if (uVar12 < uVar9 + uVar19._4_4_) {
      uVar18 = uVar19;
      if (uVar12 - uVar19._4_4_ < uVar10) {
        uVar18 = 0;
      }
      if (uVar12 < (uint)uVar19._4_4_ || uVar12 - uVar19._4_4_ == 0) {
        uVar18 = 0;
      }
      else {
        local_38 = (ulong)(uVar12 - uVar19._4_4_);
      }
      ZSTD_ldm_skipSequences(rawSeqStore,(long)pvVar20 - (long)src & 0xffffffff,uVar10);
      uVar19 = uVar18;
    }
    else {
      rawSeqStore->pos = uVar18 + 1;
    }
    UVar17 = (U32)uVar19;
    if (UVar17 != 0) {
      uVar9 = (int)src - *(int *)&(ms->window).base;
      if (ms->nextToUpdate + 0x400 < uVar9) {
        uVar12 = (uVar9 - ms->nextToUpdate) - 0x400;
        if (0x1ff < uVar12) {
          uVar12 = 0x200;
        }
        ms->nextToUpdate = uVar9 - uVar12;
      }
      ZSTD_ldm_fillFastTables(ms,src);
      sVar11 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,uVar14);
      *(undefined8 *)(rep + 1) = *(undefined8 *)rep;
      puVar3 = (undefined8 *)(uVar14 + (long)src);
      *rep = UVar17;
      puVar15 = (undefined8 *)((long)puVar3 - sVar11);
      if (puVar1 < puVar3) {
        pBVar6 = seqStore->lit;
        pBVar13 = pBVar6;
        if (puVar15 <= puVar1) {
          lVar16 = (long)puVar1 - (long)puVar15;
          pBVar13 = pBVar6 + lVar16;
          uVar8 = puVar15[1];
          *(undefined8 *)pBVar6 = *puVar15;
          *(undefined8 *)(pBVar6 + 8) = uVar8;
          puVar15 = puVar1;
          if (0x10 < lVar16) {
            lVar16 = 0x10;
            do {
              puVar5 = (undefined8 *)((long)src + lVar16 + (uVar14 - sVar11));
              uVar8 = puVar5[1];
              pBVar4 = pBVar6 + lVar16;
              *(undefined8 *)pBVar4 = *puVar5;
              *(undefined8 *)(pBVar4 + 8) = uVar8;
              puVar5 = (undefined8 *)((long)src + lVar16 + (uVar14 - sVar11) + 0x10);
              uVar8 = puVar5[1];
              *(undefined8 *)(pBVar4 + 0x10) = *puVar5;
              *(undefined8 *)(pBVar4 + 0x18) = uVar8;
              lVar16 = lVar16 + 0x20;
            } while (pBVar4 + 0x20 < pBVar13);
          }
        }
        if (puVar15 < puVar3) {
          lVar16 = 0;
          do {
            pBVar13[lVar16] = *(BYTE *)((long)puVar15 + lVar16);
            lVar16 = lVar16 + 1;
          } while ((long)puVar3 - (long)puVar15 != lVar16);
        }
      }
      else {
        pBVar13 = seqStore->lit;
        uVar8 = puVar15[1];
        *(undefined8 *)pBVar13 = *puVar15;
        *(undefined8 *)(pBVar13 + 8) = uVar8;
        if (0x10 < sVar11) {
          pBVar13 = seqStore->lit;
          uVar8 = puVar15[3];
          *(undefined8 *)(pBVar13 + 0x10) = puVar15[2];
          *(undefined8 *)(pBVar13 + 0x18) = uVar8;
          if (0x20 < (long)sVar11) {
            lVar16 = 0;
            do {
              puVar15 = (undefined8 *)((long)src + lVar16 + (uVar14 - sVar11) + 0x20);
              uVar8 = puVar15[1];
              pBVar6 = pBVar13 + lVar16 + 0x20;
              *(undefined8 *)pBVar6 = *puVar15;
              *(undefined8 *)(pBVar6 + 8) = uVar8;
              puVar15 = (undefined8 *)((long)src + lVar16 + (uVar14 - sVar11) + 0x30);
              uVar8 = puVar15[1];
              *(undefined8 *)(pBVar6 + 0x10) = *puVar15;
              *(undefined8 *)(pBVar6 + 0x18) = uVar8;
              lVar16 = lVar16 + 0x20;
            } while (pBVar6 + 0x20 < pBVar13 + sVar11);
          }
        }
      }
      seqStore->lit = seqStore->lit + sVar11;
      if (0xffff < sVar11) {
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
      }
      psVar7 = seqStore->sequences;
      psVar7->litLength = (U16)sVar11;
      psVar7->offBase = UVar17 + 3;
      if (0xffff < local_38 - 3) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos = (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3)
        ;
      }
      psVar7->mlBase = (U16)(local_38 - 3);
      seqStore->sequences = psVar7 + 1;
      src = (void *)((long)puVar3 + local_38);
    }
  } while (UVar17 != 0);
  uVar10 = (int)src - *(int *)&(ms->window).base;
  if (ms->nextToUpdate + 0x400 < uVar10) {
    uVar9 = (uVar10 - ms->nextToUpdate) - 0x400;
    if (0x1ff < uVar9) {
      uVar9 = 0x200;
    }
    ms->nextToUpdate = uVar10 - uVar9;
  }
  ZSTD_ldm_fillFastTables(ms,src);
  sVar11 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,(long)pvVar20 - (long)src);
  return sVar11;
}

Assistant:

size_t ZSTD_ldm_blockCompress(rawSeqStore_t* rawSeqStore,
    ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
    ZSTD_paramSwitch_e useRowMatchFinder,
    void const* src, size_t srcSize)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    unsigned const minMatch = cParams->minMatch;
    ZSTD_blockCompressor const blockCompressor =
        ZSTD_selectBlockCompressor(cParams->strategy, useRowMatchFinder, ZSTD_matchState_dictMode(ms));
    /* Input bounds */
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    /* Input positions */
    BYTE const* ip = istart;

    DEBUGLOG(5, "ZSTD_ldm_blockCompress: srcSize=%zu", srcSize);
    /* If using opt parser, use LDMs only as candidates rather than always accepting them */
    if (cParams->strategy >= ZSTD_btopt) {
        size_t lastLLSize;
        ms->ldmSeqStore = rawSeqStore;
        lastLLSize = blockCompressor(ms, seqStore, rep, src, srcSize);
        ZSTD_ldm_skipRawSeqStoreBytes(rawSeqStore, srcSize);
        return lastLLSize;
    }

    assert(rawSeqStore->pos <= rawSeqStore->size);
    assert(rawSeqStore->size <= rawSeqStore->capacity);
    /* Loop through each sequence and apply the block compressor to the literals */
    while (rawSeqStore->pos < rawSeqStore->size && ip < iend) {
        /* maybeSplitSequence updates rawSeqStore->pos */
        rawSeq const sequence = maybeSplitSequence(rawSeqStore,
                                                   (U32)(iend - ip), minMatch);
        /* End signal */
        if (sequence.offset == 0)
            break;

        assert(ip + sequence.litLength + sequence.matchLength <= iend);

        /* Fill tables for block compressor */
        ZSTD_ldm_limitTableUpdate(ms, ip);
        ZSTD_ldm_fillFastTables(ms, ip);
        /* Run the block compressor */
        DEBUGLOG(5, "pos %u : calling block compressor on segment of size %u", (unsigned)(ip-istart), sequence.litLength);
        {
            int i;
            size_t const newLitLength =
                blockCompressor(ms, seqStore, rep, ip, sequence.litLength);
            ip += sequence.litLength;
            /* Update the repcodes */
            for (i = ZSTD_REP_NUM - 1; i > 0; i--)
                rep[i] = rep[i-1];
            rep[0] = sequence.offset;
            /* Store the sequence */
            ZSTD_storeSeq(seqStore, newLitLength, ip - newLitLength, iend,
                          OFFSET_TO_OFFBASE(sequence.offset),
                          sequence.matchLength);
            ip += sequence.matchLength;
        }
    }
    /* Fill the tables for the block compressor */
    ZSTD_ldm_limitTableUpdate(ms, ip);
    ZSTD_ldm_fillFastTables(ms, ip);
    /* Compress the last literals */
    return blockCompressor(ms, seqStore, rep, ip, iend - ip);
}